

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureBufferCase::TextureBufferCase
          (TextureBufferCase *this,TestContext *testCtx,RenderContext *renderCtx,deUint32 format,
          size_t bufferSize,size_t offset,size_t size,RenderBits preRender,ModifyBits modify,
          RenderBits postRender,char *name,char *description)

{
  size_t offset_local;
  size_t bufferSize_local;
  deUint32 format_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  TextureBufferCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBufferCase_032e7dd0;
  this->m_renderCtx = renderCtx;
  this->m_format = format;
  this->m_bufferSize = bufferSize;
  this->m_offset = offset;
  this->m_size = size;
  this->m_preRender = preRender;
  this->m_modify = modify;
  this->m_postRender = postRender;
  this->m_preRenderProgram = (ShaderProgram *)0x0;
  this->m_postRenderProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

TextureBufferCase::TextureBufferCase (tcu::TestContext&		testCtx,
									  glu::RenderContext&	renderCtx,
									  deUint32				format,
									  size_t				bufferSize,
									  size_t				offset,
									  size_t				size,
									  RenderBits			preRender,
									  ModifyBits			modify,
									  RenderBits			postRender,
									  const char*			name,
									  const char*			description)
	: tcu::TestCase				(testCtx, name, description)
	, m_renderCtx				(renderCtx)
	, m_format					(format)
	, m_bufferSize				(bufferSize)
	, m_offset					(offset)
	, m_size					(size)

	, m_preRender				(preRender)
	, m_modify					(modify)
	, m_postRender				(postRender)

	, m_preRenderProgram		(DE_NULL)
	, m_postRenderProgram		(DE_NULL)
{
}